

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReadSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Wrd_t *pVVar8;
  long lVar9;
  char *pcVar10;
  int nArgcNew;
  char **pArgvNew;
  int fVerbose;
  int nWords;
  int fOutputs;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  pArgvNew._4_4_ = 4;
  bVar2 = false;
  Extra_UtilGetoptReset();
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"Wovh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9ReadSim(): There is no AIG.\n");
        return 1;
      }
      iVar3 = Gia_ManRegNum(pAbc->pGia);
      if (iVar3 < 1) {
        lVar9 = (long)globalUtilOptind;
        if (argc - globalUtilOptind != 1) {
          Abc_Print(-1,"File name is not given on the command line.\n");
          return 1;
        }
        if (bVar1) {
          Vec_WrdFreeP(&pAbc->pGia->vSimsPo);
          pVVar8 = Vec_WrdReadHex(argv[lVar9],(int *)0x0,1);
          pAbc->pGia->vSimsPo = pVVar8;
          iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPo);
          iVar4 = Gia_ManCoNum(pAbc->pGia);
          if (iVar3 % iVar4 != 0) {
            Vec_WrdFreeP(&pAbc->pGia->vSimsPo);
            uVar5 = Vec_WrdSize(pAbc->pGia->vSimsPo);
            uVar6 = Vec_WrdSize(pAbc->pGia->vSimsPo);
            uVar7 = Gia_ManCiNum(pAbc->pGia);
            iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPo);
            iVar4 = Gia_ManCiNum(pAbc->pGia);
            Abc_Print(-1,
                      "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n"
                      ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(long)iVar3 % (long)iVar4 & 0xffffffff
                     );
            return 1;
          }
          iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPo);
          iVar4 = Gia_ManCoNum(pAbc->pGia);
          pAbc->pGia->nSimWords = iVar3 / iVar4;
        }
        else {
          Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
          pVVar8 = Vec_WrdReadHex(argv[lVar9],(int *)0x0,1);
          pAbc->pGia->vSimsPi = pVVar8;
          iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPi);
          iVar4 = Gia_ManCiNum(pAbc->pGia);
          if (iVar3 % iVar4 != 0) {
            Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
            uVar5 = Vec_WrdSize(pAbc->pGia->vSimsPi);
            uVar6 = Vec_WrdSize(pAbc->pGia->vSimsPi);
            uVar7 = Gia_ManCiNum(pAbc->pGia);
            iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPi);
            iVar4 = Gia_ManCiNum(pAbc->pGia);
            Abc_Print(-1,
                      "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n"
                      ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(long)iVar3 % (long)iVar4 & 0xffffffff
                     );
            return 1;
          }
          iVar3 = Vec_WrdSize(pAbc->pGia->vSimsPi);
          iVar4 = Gia_ManCiNum(pAbc->pGia);
          pAbc->pGia->nSimWords = iVar3 / iVar4;
        }
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9ReadSim(): This command works only for combinational AIGs.\n");
      return 0;
    }
    switch(iVar3) {
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002a2bd4;
      }
      pArgvNew._4_4_ = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((int)pArgvNew._4_4_ < 0) {
LAB_002a2bd4:
        Abc_Print(-2,"usage: &sim_read [-W num] [-ovh] <file>\n");
        Abc_Print(-2,"\t         reads simulation patterns from file\n");
        Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                  (ulong)pArgvNew._4_4_);
        pcVar10 = "no";
        if (bVar1) {
          pcVar10 = "yes";
        }
        Abc_Print(-2,"\t-o     : toggle reading output information [default = %s]\n",pcVar10);
        pcVar10 = "no";
        if (bVar2) {
          pcVar10 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar10);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t<file> : file to store the simulation info\n");
        return 1;
      }
      break;
    default:
      goto LAB_002a2bd4;
    case 0x68:
      goto LAB_002a2bd4;
    case 0x6f:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      bVar2 = (bool)(bVar2 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReadSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fOutputs = 0, nWords = 4, fVerbose = 0;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Wovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'o':
            fOutputs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReadSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReadSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fOutputs )
    {
        Vec_WrdFreeP( &pAbc->pGia->vSimsPo );
        pAbc->pGia->vSimsPo = Vec_WrdReadHex( pArgvNew[0], NULL, 1 );
        if ( Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) != 0 )
        {
            Vec_WrdFreeP( &pAbc->pGia->vSimsPo );
            Abc_Print( -1, "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n", 
                Vec_WrdSize(pAbc->pGia->vSimsPo), Vec_WrdSize(pAbc->pGia->vSimsPo), Gia_ManCiNum(pAbc->pGia), 
                Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCiNum(pAbc->pGia) );
            return 1;
        }
        pAbc->pGia->nSimWords = Vec_WrdSize(pAbc->pGia->vSimsPo) / Gia_ManCoNum(pAbc->pGia);
    }
    else
    {
        Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
        pAbc->pGia->vSimsPi = Vec_WrdReadHex( pArgvNew[0], NULL, 1 );
        if ( Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) != 0 )
        {
            Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
            Abc_Print( -1, "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n", 
                Vec_WrdSize(pAbc->pGia->vSimsPi), Vec_WrdSize(pAbc->pGia->vSimsPi), Gia_ManCiNum(pAbc->pGia), 
                Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) );
            return 1;
        }
        pAbc->pGia->nSimWords = Vec_WrdSize(pAbc->pGia->vSimsPi) / Gia_ManCiNum(pAbc->pGia);
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_read [-W num] [-ovh] <file>\n" );
    Abc_Print( -2, "\t         reads simulation patterns from file\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-o     : toggle reading output information [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}